

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O0

void aom_highbd_dc_predictor_16x32_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long in_RSI;
  undefined8 *in_RDI;
  ushort extraout_XMM0_Wa;
  int extraout_XMM0_Da;
  int i;
  __m128i row;
  uint32_t sum32;
  __m128i sum;
  __m128i zero;
  __m128i sum_above;
  __m128i sum_left;
  int local_23c;
  uint16_t *in_stack_fffffffffffffdd8;
  undefined2 local_21c;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  uint local_1f8;
  undefined8 *local_1b0;
  
  dc_sum_32((uint16_t *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  dc_sum_16(in_stack_fffffffffffffdd8);
  local_1f8 = (uint)extraout_XMM0_Wa;
  local_21c = (undefined2)((extraout_XMM0_Da + local_1f8 + 0x18) / 0x30);
  uVar1 = CONCAT26(local_21c,CONCAT24(local_21c,CONCAT22(local_21c,local_21c)));
  uVar2 = CONCAT26(local_21c,CONCAT24(local_21c,CONCAT22(local_21c,local_21c)));
  local_1b0 = in_RDI;
  for (local_23c = 0; local_23c < 8; local_23c = local_23c + 1) {
    *local_1b0 = uVar1;
    local_1b0[1] = uVar2;
    local_1b0[2] = uVar1;
    local_1b0[3] = uVar2;
    local_1b0 = (undefined8 *)(in_RSI * 2 + (long)local_1b0);
    *local_1b0 = uVar1;
    local_1b0[1] = uVar2;
    local_1b0[2] = uVar1;
    local_1b0[3] = uVar2;
    local_1b0 = (undefined8 *)(in_RSI * 2 + (long)local_1b0);
    *local_1b0 = uVar1;
    local_1b0[1] = uVar2;
    local_1b0[2] = uVar1;
    local_1b0[3] = uVar2;
    local_1b0 = (undefined8 *)(in_RSI * 2 + (long)local_1b0);
    *local_1b0 = uVar1;
    local_1b0[1] = uVar2;
    local_1b0[2] = uVar1;
    local_1b0[3] = uVar2;
    local_1b0 = (undefined8 *)(in_RSI * 2 + (long)local_1b0);
  }
  return;
}

Assistant:

void aom_highbd_dc_predictor_16x32_sse2(uint16_t *dst, ptrdiff_t stride,
                                        const uint16_t *above,
                                        const uint16_t *left, int bd) {
  (void)bd;
  __m128i sum_left = dc_sum_32(left);
  __m128i sum_above = dc_sum_16(above);
  const __m128i zero = _mm_setzero_si128();
  sum_above = _mm_unpacklo_epi16(sum_above, zero);
  const __m128i sum = _mm_add_epi32(sum_left, sum_above);
  uint32_t sum32 = (uint32_t)_mm_cvtsi128_si32(sum);
  sum32 += 24;
  sum32 /= 48;
  const __m128i row = _mm_set1_epi16((int16_t)sum32);
  int i;
  for (i = 0; i < 8; ++i) {
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    dst += stride;
  }
}